

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O0

lzma_ret lzma_decode(void *coder_ptr,lzma_dict *dictptr,uint8_t *in,size_t *in_pos,size_t in_size)

{
  uint uVar1;
  undefined4 uVar2;
  long lVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  byte bVar7;
  uint8_t byte;
  _Bool _Var8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  uint local_124;
  uint32_t distance_2;
  uint32_t distance_1;
  uint32_t distance;
  uint32_t subcoder_index;
  uint32_t match_bit;
  uint uStack_dc;
  _Bool no_eopm;
  lzma_ret ret;
  uint32_t pos_state;
  uint32_t literal_context_bits;
  uint32_t literal_pos_mask;
  uint32_t len;
  uint32_t offset;
  uint32_t limit;
  uint32_t symbol;
  probability *probs;
  uint32_t local_b0;
  uint32_t pos_mask;
  uint32_t rep3;
  uint32_t rep2;
  uint32_t rep1;
  uint32_t rep0;
  uint32_t state;
  uint32_t rc_bound;
  size_t rc_in_pos;
  uint uStack_88;
  lzma_range_decoder rc;
  size_t dict_start;
  lzma_dict dict;
  lzma_ret ret_1;
  lzma_lzma1_decoder *coder;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_dict *dictptr_local;
  void *coder_ptr_local;
  
  dict._44_4_ = rc_read_init((lzma_range_decoder *)((long)coder_ptr + 0x6e6c),in,in_pos,in_size);
  if (dict._44_4_ != LZMA_STREAM_END) {
    return dict._44_4_;
  }
  memcpy(&dict_start,dictptr,0x30);
  rc._4_8_ = dict.buf;
  unique0x00012000 = *(undefined8 *)((long)coder_ptr + 0x6e6c);
  rc.range = *(uint32_t *)((long)coder_ptr + 0x6e74);
  _state = *in_pos;
  rep1 = *(uint32_t *)((long)coder_ptr + 0x6e78);
  rep2 = *(uint32_t *)((long)coder_ptr + 0x6e7c);
  rep3 = *(uint32_t *)((long)coder_ptr + 0x6e80);
  pos_mask = *(uint32_t *)((long)coder_ptr + 0x6e84);
  local_b0 = *(uint32_t *)((long)coder_ptr + 0x6e88);
  probs._4_4_ = *(uint *)((long)coder_ptr + 0x6e8c);
  _limit = *(void **)((long)coder_ptr + 0x6ea8);
  offset = *(uint32_t *)((long)coder_ptr + 0x6eb0);
  len = *(uint32_t *)((long)coder_ptr + 0x6eb4);
  literal_pos_mask = *(uint32_t *)((long)coder_ptr + 0x6eb8);
  literal_context_bits = *(uint32_t *)((long)coder_ptr + 0x6ebc);
  uVar1 = *(uint *)((long)coder_ptr + 0x6e94);
  uVar2 = *(undefined4 *)((long)coder_ptr + 0x6e90);
  uStack_dc = (uint)dict.buf & probs._4_4_;
  match_bit = 0;
  bVar15 = *(long *)((long)coder_ptr + 0x6e98) != -1;
  if ((bVar15) && (*(ulong *)((long)coder_ptr + 0x6e98) < dict.full - (long)dict.buf)) {
    dict.full = (size_t)(dict.buf + *(long *)((long)coder_ptr + 0x6e98));
  }
  switch(*(undefined4 *)((long)coder_ptr + 0x6ea0)) {
  case 0:
  case 1:
    while (!bVar15 || dict.buf != (uint8_t *)dict.full) {
      if (rc_in_pos._4_4_ < 0x1000000) {
        if (_state == in_size) {
          *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
          goto LAB_0066e23a;
        }
        stack0xffffffffffffff74 = CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
        _state = _state + 1;
      }
      rep0 = (rc_in_pos._4_4_ >> 0xb) *
             (uint)*(ushort *)((long)coder_ptr + (ulong)uStack_dc * 2 + (ulong)rep1 * 0x20 + 0x6000)
      ;
      if (uStack_88 < rep0) {
        stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
        lVar3 = (ulong)rep1 * 0x20 + 0x6000;
        *(short *)((long)coder_ptr + (ulong)uStack_dc * 2 + lVar3) =
             *(short *)((long)coder_ptr + (ulong)uStack_dc * 2 + lVar3) +
             (short)(0x800 - *(ushort *)
                              ((long)coder_ptr + (ulong)uStack_dc * 2 + (ulong)rep1 * 0x20 + 0x6000)
                    >> 5);
        uVar12 = (ulong)dict.buf & (ulong)uVar1;
        bVar13 = (byte)uVar2;
        bVar7 = dict_get((lzma_dict *)&dict_start,0);
        _limit = (void *)((long)coder_ptr +
                         ((uVar12 << (bVar13 & 0x3f)) +
                         (long)((int)(uint)bVar7 >> (8 - bVar13 & 0x1f))) * 0x600);
        offset = 1;
        if (rep1 < 7) {
switchD_006672c4_caseD_2:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 2;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_3:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 3;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_4:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 4;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_5:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 5;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_6:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 6;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_7:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 7;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_8:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 8;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_9:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 9;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          rep0 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < rep0) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
        }
        else {
          bVar7 = dict_get((lzma_dict *)&dict_start,rep2);
          literal_context_bits = (uint)bVar7 << 1;
          literal_pos_mask = 0x100;
switchD_006672c4_caseD_a:
          uVar10 = literal_context_bits & literal_pos_mask;
          uVar9 = literal_pos_mask + uVar10 + offset;
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 10;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar11 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2);
          if (uStack_88 < uVar11) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset << 1;
            uVar10 = uVar10 ^ 0xffffffff;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar11,rc_in_pos._4_4_ - uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar10 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_006672c4_caseD_b:
          uVar10 = literal_context_bits & literal_pos_mask;
          uVar9 = literal_pos_mask + uVar10 + offset;
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xb;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar11 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2);
          if (uStack_88 < uVar11) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset << 1;
            uVar10 = uVar10 ^ 0xffffffff;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar11,rc_in_pos._4_4_ - uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar10 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_006672c4_caseD_c:
          uVar10 = literal_context_bits & literal_pos_mask;
          uVar9 = literal_pos_mask + uVar10 + offset;
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xc;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar11 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2);
          if (uStack_88 < uVar11) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset << 1;
            uVar10 = uVar10 ^ 0xffffffff;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar11,rc_in_pos._4_4_ - uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar10 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_006672c4_caseD_d:
          uVar10 = literal_context_bits & literal_pos_mask;
          uVar9 = literal_pos_mask + uVar10 + offset;
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xd;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar11 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2);
          if (uStack_88 < uVar11) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset << 1;
            uVar10 = uVar10 ^ 0xffffffff;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar11,rc_in_pos._4_4_ - uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar10 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_006672c4_caseD_e:
          uVar10 = literal_context_bits & literal_pos_mask;
          uVar9 = literal_pos_mask + uVar10 + offset;
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xe;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar11 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2);
          if (uStack_88 < uVar11) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset << 1;
            uVar10 = uVar10 ^ 0xffffffff;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar11,rc_in_pos._4_4_ - uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar10 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_006672c4_caseD_f:
          uVar10 = literal_context_bits & literal_pos_mask;
          uVar9 = literal_pos_mask + uVar10 + offset;
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xf;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar11 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2);
          if (uStack_88 < uVar11) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset << 1;
            uVar10 = uVar10 ^ 0xffffffff;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar11,rc_in_pos._4_4_ - uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar10 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_006672c4_caseD_10:
          uVar10 = literal_context_bits & literal_pos_mask;
          uVar9 = literal_pos_mask + uVar10 + offset;
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x10;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar11 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2);
          if (uStack_88 < uVar11) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset << 1;
            uVar10 = uVar10 ^ 0xffffffff;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar11,rc_in_pos._4_4_ - uVar11);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar10 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_006672c4_caseD_11:
          uVar10 = literal_context_bits & literal_pos_mask;
          uVar9 = literal_pos_mask + uVar10 + offset;
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x11;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          rep0 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2);
          if (uStack_88 < rep0) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset << 1;
            uVar10 = uVar10 ^ 0xffffffff;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
            *(short *)((long)_limit + (ulong)uVar9 * 2) =
                 *(short *)((long)_limit + (ulong)uVar9 * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)uVar9 * 2) >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar10 & literal_pos_mask;
        }
        rep1 = lzma_decode::next_state[rep1];
switchD_006672c4_caseD_12:
        _Var8 = dict_put((lzma_dict *)&dict_start,(uint8_t)offset);
        if (_Var8) {
          *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x12;
          goto LAB_0066e23a;
        }
      }
      else {
        stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
        lVar3 = (ulong)rep1 * 0x20 + 0x6000;
        *(short *)((long)coder_ptr + (ulong)uStack_dc * 2 + lVar3) =
             *(short *)((long)coder_ptr + (ulong)uStack_dc * 2 + lVar3) -
             (short)((int)(uint)*(ushort *)
                                 ((long)coder_ptr +
                                 (ulong)uStack_dc * 2 + (ulong)rep1 * 0x20 + 0x6000) >> 5);
switchD_006672c4_caseD_13:
        if (rc_in_pos._4_4_ < 0x1000000) {
          if (_state == in_size) {
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x13;
            goto LAB_0066e23a;
          }
          stack0xffffffffffffff74 = CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8)
          ;
          _state = _state + 1;
        }
        rep0 = (rc_in_pos._4_4_ >> 0xb) *
               (uint)*(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6180);
        if (uStack_88 < rep0) {
          stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
          *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6180) =
               *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6180) +
               (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6180) >> 5);
          bVar14 = rep1 < 7;
          rep1 = 10;
          if (bVar14) {
            rep1 = 7;
          }
          local_b0 = pos_mask;
          pos_mask = rep3;
          rep3 = rep2;
          offset = 1;
switchD_006672c4_caseD_14:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x14;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)coder_ptr + 0x6664);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)coder_ptr + 0x6664) =
                 *(short *)((long)coder_ptr + 0x6664) +
                 (short)(0x800 - *(ushort *)((long)coder_ptr + 0x6664) >> 5);
switchD_006672c4_caseD_15:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x15;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                    (uint)*(ushort *)
                           ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6668;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                   (short)(0x800 - *(ushort *)
                                    ((long)coder_ptr +
                                    (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6668;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                   (short)((int)(uint)*(ushort *)
                                       ((long)coder_ptr +
                                       (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668) >> 5);
              offset = offset * 2 + 1;
            }
switchD_006672c4_caseD_16:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x16;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                    (uint)*(ushort *)
                           ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6668;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                   (short)(0x800 - *(ushort *)
                                    ((long)coder_ptr +
                                    (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6668;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                   (short)((int)(uint)*(ushort *)
                                       ((long)coder_ptr +
                                       (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668) >> 5);
              offset = offset * 2 + 1;
            }
switchD_006672c4_caseD_17:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x17;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                    (uint)*(ushort *)
                           ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6668;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                   (short)(0x800 - *(ushort *)
                                    ((long)coder_ptr +
                                    (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6668;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                   (short)((int)(uint)*(ushort *)
                                       ((long)coder_ptr +
                                       (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6668) >> 5);
              offset = offset * 2 + 1;
            }
            literal_context_bits = offset - 6;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)coder_ptr + 0x6664) =
                 *(short *)((long)coder_ptr + 0x6664) -
                 (short)((int)(uint)*(ushort *)((long)coder_ptr + 0x6664) >> 5);
switchD_006672c4_caseD_18:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x18;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)coder_ptr + 0x6666);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              *(short *)((long)coder_ptr + 0x6666) =
                   *(short *)((long)coder_ptr + 0x6666) +
                   (short)(0x800 - *(ushort *)((long)coder_ptr + 0x6666) >> 5);
switchD_006672c4_caseD_19:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x19;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)
                             ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768
                             );
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6768;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                     (short)(0x800 - *(ushort *)
                                      ((long)coder_ptr +
                                      (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768) >> 5);
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6768;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                     (short)((int)(uint)*(ushort *)
                                         ((long)coder_ptr +
                                         (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768) >> 5)
                ;
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_1a:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1a;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)
                             ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768
                             );
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6768;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                     (short)(0x800 - *(ushort *)
                                      ((long)coder_ptr +
                                      (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768) >> 5);
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6768;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                     (short)((int)(uint)*(ushort *)
                                         ((long)coder_ptr +
                                         (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768) >> 5)
                ;
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_1b:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1b;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)
                             ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768
                             );
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6768;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                     (short)(0x800 - *(ushort *)
                                      ((long)coder_ptr +
                                      (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768) >> 5);
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6768;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                     (short)((int)(uint)*(ushort *)
                                         ((long)coder_ptr +
                                         (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6768) >> 5)
                ;
                offset = offset * 2 + 1;
              }
              literal_context_bits = offset + 2;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              *(short *)((long)coder_ptr + 0x6666) =
                   *(short *)((long)coder_ptr + 0x6666) -
                   (short)((int)(uint)*(ushort *)((long)coder_ptr + 0x6666) >> 5);
switchD_006672c4_caseD_1c:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1c;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_1d:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1d;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_1e:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1e;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_1f:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1f;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_20:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x20;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_21:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x21;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_22:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x22;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_23:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x23;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6868) >>
                            5);
                offset = offset * 2 + 1;
              }
              literal_context_bits = offset - 0xee;
            }
          }
          if (literal_context_bits < 6) {
            local_124 = literal_context_bits - 2;
          }
          else {
            local_124 = 3;
          }
          _limit = (void *)((long)coder_ptr + (ulong)local_124 * 0x80 + 0x6360);
          offset = 1;
switchD_006672c4_caseD_24:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x24;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_25:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x25;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_26:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x26;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_27:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x27;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_28:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x28;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
switchD_006672c4_caseD_29:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x29;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          rep0 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
          if (uStack_88 < rep0) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) +
                 (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset << 1;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
            *(short *)((long)_limit + (ulong)offset * 2) =
                 *(short *)((long)_limit + (ulong)offset * 2) -
                 (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
            offset = offset * 2 + 1;
          }
          offset = offset - 0x40;
          if (0x3f < offset) {
            __assert_fail("symbol <= 63",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x218,
                          "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          uVar6 = offset;
          if (3 < offset) {
            len = (offset >> 1) - 1;
            if ((len == 0) || (0x1e < len)) {
              __assert_fail("limit >= 1 && limit <= 30",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x221,
                            "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            rep2 = (offset & 1) + 2;
            if (0xd < offset) {
              if (offset < 0xe) {
                __assert_fail("symbol >= 14",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x26a,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              if (len < 6) {
                __assert_fail("limit >= 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x26b,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              len = (offset >> 1) - 5;
              if (len < 2) {
                __assert_fail("limit >= 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x26d,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
switchD_006672c4_caseD_2b:
              do {
                if (rc_in_pos._4_4_ < 0x1000000) {
                  if (_state == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2b;
                    goto LAB_0066e23a;
                  }
                  stack0xffffffffffffff74 =
                       CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                  _state = _state + 1;
                }
                uVar10 = rc_in_pos._4_4_ >> 1;
                uVar9 = (int)(uStack_88 - uVar10) >> 0x1f;
                stack0xffffffffffffff74 = CONCAT44((uVar10 & uVar9) + (uStack_88 - uVar10),uVar10);
                rep2 = rep2 * 2 + uVar9 + 1;
                len = len - 1;
              } while (len != 0);
              rep2 = rep2 * 0x10;
              offset = 1;
switchD_006672c4_caseD_2c:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2c;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) >>
                            5);
                offset = offset * 2 + 1;
                rep2 = rep2 + 1;
              }
switchD_006672c4_caseD_2d:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2d;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) >>
                            5);
                offset = offset * 2 + 1;
                rep2 = rep2 + 2;
              }
switchD_006672c4_caseD_2e:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2e;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) >>
                            5);
                offset = offset * 2 + 1;
                rep2 = rep2 + 4;
              }
switchD_006672c4_caseD_2f:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2f;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              rep0 = (rc_in_pos._4_4_ >> 0xb) *
                     (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644);
              if (uStack_88 < rep0) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) >> 5)
                ;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6644) >>
                            5);
                rep2 = rep2 + 8;
              }
              uVar6 = rep2;
              if (rep2 != 0xffffffff) goto switchD_0066b1f8_default;
              if (*(long *)((long)coder_ptr + 0x6e98) == -1) goto switchD_006672c4_caseD_30;
              match_bit = 9;
              goto LAB_0066e23a;
            }
            if (5 < len) {
              __assert_fail("limit <= 5",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x227,
                            "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            rep2 = rep2 << ((byte)len & 0x1f);
            if (0x60 < rep2) {
              __assert_fail("rep0 <= 96",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x229,
                            "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            if ((int)((rep2 - offset) + -1) < -1) {
              __assert_fail("(int32_t)(rep0 - symbol - 1) >= -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x231,
                            "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            if (0x52 < (int)((rep2 - offset) + -1)) {
              __assert_fail("(int32_t)(rep0 - symbol - 1) <= 82",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x233,
                            "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            _limit = (void *)((long)coder_ptr + (ulong)offset * -2 + (ulong)rep2 * 2 + 0x655e);
            offset = 1;
            literal_pos_mask = 0;
switchD_006672c4_caseD_2a:
            uVar6 = rep2;
            switch(len) {
            case 1:
              goto switchD_0066b1f8_caseD_1;
            case 2:
              goto switchD_0066b1f8_caseD_2;
            case 3:
              goto switchD_0066b1f8_caseD_3;
            case 4:
              break;
            case 5:
              if (literal_pos_mask != 0) {
                __assert_fail("offset == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x242,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2)
              ;
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)_limit + (ulong)offset * 2) =
                     *(short *)((long)_limit + (ulong)offset * 2) +
                     (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)_limit + (ulong)offset * 2) =
                     *(short *)((long)_limit + (ulong)offset * 2) -
                     (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
                offset = offset * 2 + 1;
                rep2 = rep2 + 1;
              }
              literal_pos_mask = 1;
              len = len - 1;
              break;
            default:
              goto switchD_0066b1f8_default;
            }
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              *(short *)((long)_limit + (ulong)offset * 2) =
                   *(short *)((long)_limit + (ulong)offset * 2) +
                   (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              *(short *)((long)_limit + (ulong)offset * 2) =
                   *(short *)((long)_limit + (ulong)offset * 2) -
                   (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
              offset = offset * 2 + 1;
              rep2 = (1 << ((byte)literal_pos_mask & 0x1f)) + rep2;
            }
            literal_pos_mask = literal_pos_mask + 1;
            len = len - 1;
switchD_0066b1f8_caseD_3:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              *(short *)((long)_limit + (ulong)offset * 2) =
                   *(short *)((long)_limit + (ulong)offset * 2) +
                   (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              *(short *)((long)_limit + (ulong)offset * 2) =
                   *(short *)((long)_limit + (ulong)offset * 2) -
                   (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
              offset = offset * 2 + 1;
              rep2 = (1 << ((byte)literal_pos_mask & 0x1f)) + rep2;
            }
            literal_pos_mask = literal_pos_mask + 1;
            len = len - 1;
switchD_0066b1f8_caseD_2:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              *(short *)((long)_limit + (ulong)offset * 2) =
                   *(short *)((long)_limit + (ulong)offset * 2) +
                   (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              *(short *)((long)_limit + (ulong)offset * 2) =
                   *(short *)((long)_limit + (ulong)offset * 2) -
                   (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
              offset = offset * 2 + 1;
              rep2 = (1 << ((byte)literal_pos_mask & 0x1f)) + rep2;
            }
            literal_pos_mask = literal_pos_mask + 1;
            len = len - 1;
switchD_0066b1f8_caseD_1:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            rep0 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)_limit + (ulong)offset * 2);
            if (uStack_88 < rep0) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
              *(short *)((long)_limit + (ulong)offset * 2) =
                   *(short *)((long)_limit + (ulong)offset * 2) +
                   (short)(0x800 - *(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
              uVar6 = rep2;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
              *(short *)((long)_limit + (ulong)offset * 2) =
                   *(short *)((long)_limit + (ulong)offset * 2) -
                   (short)((int)(uint)*(ushort *)((long)_limit + (ulong)offset * 2) >> 5);
              uVar6 = (1 << ((byte)literal_pos_mask & 0x1f)) + rep2;
            }
          }
switchD_0066b1f8_default:
          rep2 = uVar6;
          _Var8 = dict_is_distance_valid((lzma_dict *)&dict_start,(ulong)rep2);
          if (((_Var8 ^ 0xffU) & 1) != 0) {
            match_bit = 9;
            goto LAB_0066e23a;
          }
        }
        else {
          stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
          *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6180) =
               *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6180) -
               (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6180) >> 5);
          _Var8 = dict_is_distance_valid((lzma_dict *)&dict_start,0);
          if (((_Var8 ^ 0xffU) & 1) != 0) {
            match_bit = 9;
            goto LAB_0066e23a;
          }
switchD_006672c4_caseD_31:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x31;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                  (uint)*(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6198);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6198) =
                 *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6198) +
                 (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6198) >> 5);
switchD_006672c4_caseD_33:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x33;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            rep0 = (rc_in_pos._4_4_ >> 0xb) *
                   (uint)*(ushort *)
                          ((long)coder_ptr + (ulong)uStack_dc * 2 + (ulong)rep1 * 0x20 + 0x61e0);
            if (uStack_88 < rep0) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
              lVar3 = (ulong)rep1 * 0x20 + 0x61e0;
              *(short *)((long)coder_ptr + (ulong)uStack_dc * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)uStack_dc * 2 + lVar3) +
                   (short)(0x800 - *(ushort *)
                                    ((long)coder_ptr +
                                    (ulong)uStack_dc * 2 + (ulong)rep1 * 0x20 + 0x61e0) >> 5);
              bVar14 = rep1 < 7;
              rep1 = 0xb;
              if (bVar14) {
                rep1 = 9;
              }
switchD_006672c4_caseD_32:
              byte = dict_get((lzma_dict *)&dict_start,rep2);
              _Var8 = dict_put((lzma_dict *)&dict_start,byte);
              if (!_Var8) goto LAB_006672c6;
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x32;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
            lVar3 = (ulong)rep1 * 0x20 + 0x61e0;
            *(short *)((long)coder_ptr + (ulong)uStack_dc * 2 + lVar3) =
                 *(short *)((long)coder_ptr + (ulong)uStack_dc * 2 + lVar3) -
                 (short)((int)(uint)*(ushort *)
                                     ((long)coder_ptr +
                                     (ulong)uStack_dc * 2 + (ulong)rep1 * 0x20 + 0x61e0) >> 5);
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6198) =
                 *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6198) -
                 (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x6198) >> 5);
switchD_006672c4_caseD_34:
            uVar6 = rep3;
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x34;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                    (uint)*(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61b0);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61b0) =
                   *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61b0) +
                   (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61b0) >> 5);
              rep3 = rep2;
              rep2 = uVar6;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61b0) =
                   *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61b0) -
                   (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61b0) >> 5);
switchD_006672c4_caseD_35:
              uVar5 = rep2;
              uVar4 = rep3;
              uVar6 = local_b0;
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x35;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61c8);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61c8) =
                     *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61c8) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61c8) >> 5);
                rep2 = pos_mask;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61c8) =
                     *(short *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61c8) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)rep1 * 2 + 0x61c8) >> 5
                            );
                local_b0 = pos_mask;
                rep2 = uVar6;
              }
              rep3 = uVar5;
              pos_mask = uVar4;
            }
          }
          bVar14 = rep1 < 7;
          rep1 = 0xb;
          if (bVar14) {
            rep1 = 8;
          }
          offset = 1;
switchD_006672c4_caseD_36:
          if (rc_in_pos._4_4_ < 0x1000000) {
            if (_state == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x36;
              goto LAB_0066e23a;
            }
            stack0xffffffffffffff74 =
                 CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
            _state = _state + 1;
          }
          uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)coder_ptr + 0x6a68);
          if (uStack_88 < uVar9) {
            stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
            *(short *)((long)coder_ptr + 0x6a68) =
                 *(short *)((long)coder_ptr + 0x6a68) +
                 (short)(0x800 - *(ushort *)((long)coder_ptr + 0x6a68) >> 5);
switchD_006672c4_caseD_37:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x37;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                    (uint)*(ushort *)
                           ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6a6c;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                   (short)(0x800 - *(ushort *)
                                    ((long)coder_ptr +
                                    (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6a6c;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                   (short)((int)(uint)*(ushort *)
                                       ((long)coder_ptr +
                                       (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c) >> 5);
              offset = offset * 2 + 1;
            }
switchD_006672c4_caseD_38:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x38;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                    (uint)*(ushort *)
                           ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6a6c;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                   (short)(0x800 - *(ushort *)
                                    ((long)coder_ptr +
                                    (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6a6c;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                   (short)((int)(uint)*(ushort *)
                                       ((long)coder_ptr +
                                       (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c) >> 5);
              offset = offset * 2 + 1;
            }
switchD_006672c4_caseD_39:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x39;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            rep0 = (rc_in_pos._4_4_ >> 0xb) *
                   (uint)*(ushort *)
                          ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c);
            if (uStack_88 < rep0) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6a6c;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                   (short)(0x800 - *(ushort *)
                                    ((long)coder_ptr +
                                    (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c) >> 5);
              offset = offset << 1;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
              lVar3 = (ulong)uStack_dc * 0x10 + 0x6a6c;
              *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                   *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                   (short)((int)(uint)*(ushort *)
                                       ((long)coder_ptr +
                                       (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6a6c) >> 5);
              offset = offset * 2 + 1;
            }
            literal_context_bits = offset - 6;
          }
          else {
            stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
            *(short *)((long)coder_ptr + 0x6a68) =
                 *(short *)((long)coder_ptr + 0x6a68) -
                 (short)((int)(uint)*(ushort *)((long)coder_ptr + 0x6a68) >> 5);
switchD_006672c4_caseD_3a:
            if (rc_in_pos._4_4_ < 0x1000000) {
              if (_state == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3a;
                goto LAB_0066e23a;
              }
              stack0xffffffffffffff74 =
                   CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
              _state = _state + 1;
            }
            uVar9 = (rc_in_pos._4_4_ >> 0xb) * (uint)*(ushort *)((long)coder_ptr + 0x6a6a);
            if (uStack_88 < uVar9) {
              stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
              *(short *)((long)coder_ptr + 0x6a6a) =
                   *(short *)((long)coder_ptr + 0x6a6a) +
                   (short)(0x800 - *(ushort *)((long)coder_ptr + 0x6a6a) >> 5);
switchD_006672c4_caseD_3b:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3b;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)
                             ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c
                             );
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6b6c;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                     (short)(0x800 - *(ushort *)
                                      ((long)coder_ptr +
                                      (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c) >> 5);
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6b6c;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                     (short)((int)(uint)*(ushort *)
                                         ((long)coder_ptr +
                                         (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c) >> 5)
                ;
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_3c:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3c;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)
                             ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c
                             );
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6b6c;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                     (short)(0x800 - *(ushort *)
                                      ((long)coder_ptr +
                                      (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c) >> 5);
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6b6c;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                     (short)((int)(uint)*(ushort *)
                                         ((long)coder_ptr +
                                         (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c) >> 5)
                ;
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_3d:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3d;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              rep0 = (rc_in_pos._4_4_ >> 0xb) *
                     (uint)*(ushort *)
                            ((long)coder_ptr + (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c)
              ;
              if (uStack_88 < rep0) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6b6c;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) +
                     (short)(0x800 - *(ushort *)
                                      ((long)coder_ptr +
                                      (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c) >> 5);
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
                lVar3 = (ulong)uStack_dc * 0x10 + 0x6b6c;
                *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + lVar3) -
                     (short)((int)(uint)*(ushort *)
                                         ((long)coder_ptr +
                                         (ulong)offset * 2 + (ulong)uStack_dc * 0x10 + 0x6b6c) >> 5)
                ;
                offset = offset * 2 + 1;
              }
              literal_context_bits = offset + 2;
            }
            else {
              stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
              *(short *)((long)coder_ptr + 0x6a6a) =
                   *(short *)((long)coder_ptr + 0x6a6a) -
                   (short)((int)(uint)*(ushort *)((long)coder_ptr + 0x6a6a) >> 5);
switchD_006672c4_caseD_3e:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3e;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_3f:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3f;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_40:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x40;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_41:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x41;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_42:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x42;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_43:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x43;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_44:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x44;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              uVar9 = (rc_in_pos._4_4_ >> 0xb) *
                      (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c);
              if (uStack_88 < uVar9) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - uVar9,rc_in_pos._4_4_ - uVar9);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >>
                            5);
                offset = offset * 2 + 1;
              }
switchD_006672c4_caseD_45:
              if (rc_in_pos._4_4_ < 0x1000000) {
                if (_state == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x45;
                  goto LAB_0066e23a;
                }
                stack0xffffffffffffff74 =
                     CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
                _state = _state + 1;
              }
              rep0 = (rc_in_pos._4_4_ >> 0xb) *
                     (uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c);
              if (uStack_88 < rep0) {
                stack0xffffffffffffff74 = CONCAT44(uStack_88,rep0);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) +
                     (short)(0x800 - *(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >> 5)
                ;
                offset = offset << 1;
              }
              else {
                stack0xffffffffffffff74 = CONCAT44(uStack_88 - rep0,rc_in_pos._4_4_ - rep0);
                *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) =
                     *(short *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) -
                     (short)((int)(uint)*(ushort *)((long)coder_ptr + (ulong)offset * 2 + 0x6c6c) >>
                            5);
                offset = offset * 2 + 1;
              }
              literal_context_bits = offset - 0xee;
            }
          }
        }
        if (literal_context_bits < 2) {
          __assert_fail("len >= MATCH_LEN_MIN",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x311,
                        "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        if (0x111 < literal_context_bits) {
          __assert_fail("len <= MATCH_LEN_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x312,
                        "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
switchD_006672c4_caseD_46:
        _Var8 = dict_repeat((lzma_dict *)&dict_start,rep2,&literal_context_bits);
        if (_Var8) {
          *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x46;
          goto LAB_0066e23a;
        }
      }
LAB_006672c6:
      uStack_dc = (uint)dict.buf & probs._4_4_;
    }
    break;
  case 2:
    goto switchD_006672c4_caseD_2;
  case 3:
    goto switchD_006672c4_caseD_3;
  case 4:
    goto switchD_006672c4_caseD_4;
  case 5:
    goto switchD_006672c4_caseD_5;
  case 6:
    goto switchD_006672c4_caseD_6;
  case 7:
    goto switchD_006672c4_caseD_7;
  case 8:
    goto switchD_006672c4_caseD_8;
  case 9:
    goto switchD_006672c4_caseD_9;
  case 10:
    goto switchD_006672c4_caseD_a;
  case 0xb:
    goto switchD_006672c4_caseD_b;
  case 0xc:
    goto switchD_006672c4_caseD_c;
  case 0xd:
    goto switchD_006672c4_caseD_d;
  case 0xe:
    goto switchD_006672c4_caseD_e;
  case 0xf:
    goto switchD_006672c4_caseD_f;
  case 0x10:
    goto switchD_006672c4_caseD_10;
  case 0x11:
    goto switchD_006672c4_caseD_11;
  case 0x12:
    goto switchD_006672c4_caseD_12;
  case 0x13:
    goto switchD_006672c4_caseD_13;
  case 0x14:
    goto switchD_006672c4_caseD_14;
  case 0x15:
    goto switchD_006672c4_caseD_15;
  case 0x16:
    goto switchD_006672c4_caseD_16;
  case 0x17:
    goto switchD_006672c4_caseD_17;
  case 0x18:
    goto switchD_006672c4_caseD_18;
  case 0x19:
    goto switchD_006672c4_caseD_19;
  case 0x1a:
    goto switchD_006672c4_caseD_1a;
  case 0x1b:
    goto switchD_006672c4_caseD_1b;
  case 0x1c:
    goto switchD_006672c4_caseD_1c;
  case 0x1d:
    goto switchD_006672c4_caseD_1d;
  case 0x1e:
    goto switchD_006672c4_caseD_1e;
  case 0x1f:
    goto switchD_006672c4_caseD_1f;
  case 0x20:
    goto switchD_006672c4_caseD_20;
  case 0x21:
    goto switchD_006672c4_caseD_21;
  case 0x22:
    goto switchD_006672c4_caseD_22;
  case 0x23:
    goto switchD_006672c4_caseD_23;
  case 0x24:
    goto switchD_006672c4_caseD_24;
  case 0x25:
    goto switchD_006672c4_caseD_25;
  case 0x26:
    goto switchD_006672c4_caseD_26;
  case 0x27:
    goto switchD_006672c4_caseD_27;
  case 0x28:
    goto switchD_006672c4_caseD_28;
  case 0x29:
    goto switchD_006672c4_caseD_29;
  case 0x2a:
    goto switchD_006672c4_caseD_2a;
  case 0x2b:
    goto switchD_006672c4_caseD_2b;
  case 0x2c:
    goto switchD_006672c4_caseD_2c;
  case 0x2d:
    goto switchD_006672c4_caseD_2d;
  case 0x2e:
    goto switchD_006672c4_caseD_2e;
  case 0x2f:
    goto switchD_006672c4_caseD_2f;
  case 0x30:
switchD_006672c4_caseD_30:
    if (rc_in_pos._4_4_ < 0x1000000) {
      if (_state == in_size) {
        *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x30;
        goto LAB_0066e23a;
      }
      stack0xffffffffffffff74 = CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
      _state = _state + 1;
    }
    match_bit = 1;
    goto LAB_0066e23a;
  case 0x31:
    goto switchD_006672c4_caseD_31;
  case 0x32:
    goto switchD_006672c4_caseD_32;
  case 0x33:
    goto switchD_006672c4_caseD_33;
  case 0x34:
    goto switchD_006672c4_caseD_34;
  case 0x35:
    goto switchD_006672c4_caseD_35;
  case 0x36:
    goto switchD_006672c4_caseD_36;
  case 0x37:
    goto switchD_006672c4_caseD_37;
  case 0x38:
    goto switchD_006672c4_caseD_38;
  case 0x39:
    goto switchD_006672c4_caseD_39;
  case 0x3a:
    goto switchD_006672c4_caseD_3a;
  case 0x3b:
    goto switchD_006672c4_caseD_3b;
  case 0x3c:
    goto switchD_006672c4_caseD_3c;
  case 0x3d:
    goto switchD_006672c4_caseD_3d;
  case 0x3e:
    goto switchD_006672c4_caseD_3e;
  case 0x3f:
    goto switchD_006672c4_caseD_3f;
  case 0x40:
    goto switchD_006672c4_caseD_40;
  case 0x41:
    goto switchD_006672c4_caseD_41;
  case 0x42:
    goto switchD_006672c4_caseD_42;
  case 0x43:
    goto switchD_006672c4_caseD_43;
  case 0x44:
    goto switchD_006672c4_caseD_44;
  case 0x45:
    goto switchD_006672c4_caseD_45;
  case 0x46:
    goto switchD_006672c4_caseD_46;
  }
  if (rc_in_pos._4_4_ < 0x1000000) {
    if (_state == in_size) {
      *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0;
      goto LAB_0066e23a;
    }
    stack0xffffffffffffff74 = CONCAT44(uStack_88 << 8 | (uint)in[_state],rc_in_pos._4_4_ << 8);
    _state = _state + 1;
  }
  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
LAB_0066e23a:
  dictptr->pos = (size_t)dict.buf;
  dictptr->full = dict.pos;
  *(undefined8 *)((long)coder_ptr + 0x6e6c) = stack0xffffffffffffff74;
  *(uint32_t *)((long)coder_ptr + 0x6e74) = rc.range;
  *in_pos = _state;
  *(uint32_t *)((long)coder_ptr + 0x6e78) = rep1;
  *(uint32_t *)((long)coder_ptr + 0x6e7c) = rep2;
  *(uint32_t *)((long)coder_ptr + 0x6e80) = rep3;
  *(uint32_t *)((long)coder_ptr + 0x6e84) = pos_mask;
  *(uint32_t *)((long)coder_ptr + 0x6e88) = local_b0;
  *(void **)((long)coder_ptr + 0x6ea8) = _limit;
  *(uint32_t *)((long)coder_ptr + 0x6eb0) = offset;
  *(uint32_t *)((long)coder_ptr + 0x6eb4) = len;
  *(uint32_t *)((long)coder_ptr + 0x6eb8) = literal_pos_mask;
  *(uint32_t *)((long)coder_ptr + 0x6ebc) = literal_context_bits;
  if ((((*(long *)((long)coder_ptr + 0x6e98) != -1) &&
       (*(long *)((long)coder_ptr + 0x6e98) =
             *(long *)((long)coder_ptr + 0x6e98) - ((long)dict.buf - rc._4_8_),
       *(long *)((long)coder_ptr + 0x6e98) == 0)) && (match_bit == 0)) &&
     ((*(int *)((long)coder_ptr + 0x6ea0) != 0 &&
      (match_bit = 9, *(int *)((long)coder_ptr + 0x6ea0) == 1)))) {
    match_bit = 1;
  }
  if (match_bit == 1) {
    if (*(int *)((long)coder_ptr + 0x6e70) != 0) {
      match_bit = 9;
    }
    *(undefined4 *)((long)coder_ptr + 0x6e6c) = 0xffffffff;
    *(undefined4 *)((long)coder_ptr + 0x6e70) = 0;
    *(undefined4 *)((long)coder_ptr + 0x6e74) = 5;
  }
  return match_bit;
}

Assistant:

static lzma_ret
lzma_decode(void *coder_ptr, lzma_dict *restrict dictptr,
		const uint8_t *restrict in,
		size_t *restrict in_pos, size_t in_size)
{
	lzma_lzma1_decoder *restrict coder = coder_ptr;

	////////////////////
	// Initialization //
	////////////////////

	{
		const lzma_ret ret = rc_read_init(
				&coder->rc, in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			return ret;
	}

	///////////////
	// Variables //
	///////////////

	// Making local copies of often-used variables improves both
	// speed and readability.

	lzma_dict dict = *dictptr;

	const size_t dict_start = dict.pos;

	// Range decoder
	rc_to_local(coder->rc, *in_pos);

	// State
	uint32_t state = coder->state;
	uint32_t rep0 = coder->rep0;
	uint32_t rep1 = coder->rep1;
	uint32_t rep2 = coder->rep2;
	uint32_t rep3 = coder->rep3;

	const uint32_t pos_mask = coder->pos_mask;

	// These variables are actually needed only if we last time ran
	// out of input in the middle of the decoder loop.
	probability *probs = coder->probs;
	uint32_t symbol = coder->symbol;
	uint32_t limit = coder->limit;
	uint32_t offset = coder->offset;
	uint32_t len = coder->len;

	const uint32_t literal_pos_mask = coder->literal_pos_mask;
	const uint32_t literal_context_bits = coder->literal_context_bits;

	// Temporary variables
	uint32_t pos_state = dict.pos & pos_mask;

	lzma_ret ret = LZMA_OK;

	// If uncompressed size is known, there must be no end of payload
	// marker.
	const bool no_eopm = coder->uncompressed_size
			!= LZMA_VLI_UNKNOWN;
	if (no_eopm && coder->uncompressed_size < dict.limit - dict.pos)
		dict.limit = dict.pos + (size_t)(coder->uncompressed_size);

	// The main decoder loop. The "switch" is used to restart the decoder at
	// correct location. Once restarted, the "switch" is no longer used.
	switch (coder->sequence)
	while (true) {
		// Calculate new pos_state. This is skipped on the first loop
		// since we already calculated it when setting up the local
		// variables.
		pos_state = dict.pos & pos_mask;

	case SEQ_NORMALIZE:
	case SEQ_IS_MATCH:
		if (unlikely(no_eopm && dict.pos == dict.limit))
			break;

		rc_if_0(coder->is_match[state][pos_state], SEQ_IS_MATCH) {
			rc_update_0(coder->is_match[state][pos_state]);

			// It's a literal i.e. a single 8-bit byte.

			probs = literal_subcoder(coder->literal,
					literal_context_bits, literal_pos_mask,
					dict.pos, dict_get(&dict, 0));
			symbol = 1;

			if (is_literal_state(state)) {
				// Decode literal without match byte.
#ifdef HAVE_SMALL
	case SEQ_LITERAL:
				do {
					rc_bit(probs[symbol], , , SEQ_LITERAL);
				} while (symbol < (1 << 8));
#else
				rc_bit_case(probs[symbol], , , SEQ_LITERAL0);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL1);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL2);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL3);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL4);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL5);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL6);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL7);
#endif
			} else {
				// Decode literal with match byte.
				//
				// We store the byte we compare against
				// ("match byte") to "len" to minimize the
				// number of variables we need to store
				// between decoder calls.
				len = dict_get(&dict, rep0) << 1;

				// The usage of "offset" allows omitting some
				// branches, which should give tiny speed
				// improvement on some CPUs. "offset" gets
				// set to zero if match_bit didn't match.
				offset = 0x100;

#ifdef HAVE_SMALL
	case SEQ_LITERAL_MATCHED:
				do {
					const uint32_t match_bit
							= len & offset;
					const uint32_t subcoder_index
							= offset + match_bit
							+ symbol;

					rc_bit(probs[subcoder_index],
							offset &= ~match_bit,
							offset &= match_bit,
							SEQ_LITERAL_MATCHED);

					// It seems to be faster to do this
					// here instead of putting it to the
					// beginning of the loop and then
					// putting the "case" in the middle
					// of the loop.
					len <<= 1;

				} while (symbol < (1 << 8));
#else
				// Unroll the loop.
				uint32_t match_bit;
				uint32_t subcoder_index;

#	define d(seq) \
		case seq: \
			match_bit = len & offset; \
			subcoder_index = offset + match_bit + symbol; \
			rc_bit(probs[subcoder_index], \
					offset &= ~match_bit, \
					offset &= match_bit, \
					seq)

				d(SEQ_LITERAL_MATCHED0);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED1);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED2);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED3);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED4);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED5);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED6);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED7);
#	undef d
#endif
			}

			//update_literal(state);
			// Use a lookup table to update to literal state,
			// since compared to other state updates, this would
			// need two branches.
			static const lzma_lzma_state next_state[] = {
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_MATCH_LIT_LIT,
				STATE_REP_LIT_LIT,
				STATE_SHORTREP_LIT_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT,
				STATE_SHORTREP_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT
			};
			state = next_state[state];

	case SEQ_LITERAL_WRITE:
			if (unlikely(dict_put(&dict, symbol))) {
				coder->sequence = SEQ_LITERAL_WRITE;
				goto out;
			}

			continue;
		}

		// Instead of a new byte we are going to get a byte range
		// (distance and length) which will be repeated from our
		// output history.

		rc_update_1(coder->is_match[state][pos_state]);

	case SEQ_IS_REP:
		rc_if_0(coder->is_rep[state], SEQ_IS_REP) {
			// Not a repeated match
			rc_update_0(coder->is_rep[state]);
			update_match(state);

			// The latest three match distances are kept in
			// memory in case there are repeated matches.
			rep3 = rep2;
			rep2 = rep1;
			rep1 = rep0;

			// Decode the length of the match.
			len_decode(len, coder->match_len_decoder,
					pos_state, SEQ_MATCH_LEN);

			// Prepare to decode the highest two bits of the
			// match distance.
			probs = coder->dist_slot[get_dist_state(len)];
			symbol = 1;

#ifdef HAVE_SMALL
	case SEQ_DIST_SLOT:
			do {
				rc_bit(probs[symbol], , , SEQ_DIST_SLOT);
			} while (symbol < DIST_SLOTS);
#else
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT0);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT1);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT2);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT3);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT4);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT5);
#endif
			// Get rid of the highest bit that was needed for
			// indexing of the probability array.
			symbol -= DIST_SLOTS;
			assert(symbol <= 63);

			if (symbol < DIST_MODEL_START) {
				// Match distances [0, 3] have only two bits.
				rep0 = symbol;
			} else {
				// Decode the lowest [1, 29] bits of
				// the match distance.
				limit = (symbol >> 1) - 1;
				assert(limit >= 1 && limit <= 30);
				rep0 = 2 + (symbol & 1);

				if (symbol < DIST_MODEL_END) {
					// Prepare to decode the low bits for
					// a distance of [4, 127].
					assert(limit <= 5);
					rep0 <<= limit;
					assert(rep0 <= 96);
					// -1 is fine, because we start
					// decoding at probs[1], not probs[0].
					// NOTE: This violates the C standard,
					// since we are doing pointer
					// arithmetic past the beginning of
					// the array.
					assert((int32_t)(rep0 - symbol - 1)
							>= -1);
					assert((int32_t)(rep0 - symbol - 1)
							<= 82);
					probs = coder->pos_special + rep0
							- symbol - 1;
					symbol = 1;
					offset = 0;
	case SEQ_DIST_MODEL:
#ifdef HAVE_SMALL
					do {
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
					} while (++offset < limit);
#else
					switch (limit) {
					case 5:
						assert(offset == 0);
						rc_bit(probs[symbol], ,
							rep0 += 1,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 4:
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 3:
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 2:
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 1:
						// We need "symbol" only for
						// indexing the probability
						// array, thus we can use
						// rc_bit_last() here to omit
						// the unneeded updating of
						// "symbol".
						rc_bit_last(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
					}
#endif
				} else {
					// The distance is >= 128. Decode the
					// lower bits without probabilities
					// except the lowest four bits.
					assert(symbol >= 14);
					assert(limit >= 6);
					limit -= ALIGN_BITS;
					assert(limit >= 2);
	case SEQ_DIRECT:
					// Not worth manual unrolling
					do {
						rc_direct(rep0, SEQ_DIRECT);
					} while (--limit > 0);

					// Decode the lowest four bits using
					// probabilities.
					rep0 <<= ALIGN_BITS;
					symbol = 1;
#ifdef HAVE_SMALL
					offset = 0;
	case SEQ_ALIGN:
					do {
						rc_bit(coder->pos_align[
								symbol], ,
							rep0 += 1 << offset,
							SEQ_ALIGN);
					} while (++offset < ALIGN_BITS);
#else
	case SEQ_ALIGN0:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 1, SEQ_ALIGN0);
	case SEQ_ALIGN1:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 2, SEQ_ALIGN1);
	case SEQ_ALIGN2:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 4, SEQ_ALIGN2);
	case SEQ_ALIGN3:
					// Like in SEQ_DIST_MODEL, we don't
					// need "symbol" for anything else
					// than indexing the probability array.
					rc_bit_last(coder->pos_align[symbol], ,
							rep0 += 8, SEQ_ALIGN3);
#endif

					if (rep0 == UINT32_MAX) {
						// End of payload marker was
						// found. It must not be
						// present if uncompressed
						// size is known.
						if (coder->uncompressed_size
						!= LZMA_VLI_UNKNOWN) {
							ret = LZMA_DATA_ERROR;
							goto out;
						}

	case SEQ_EOPM:
						// LZMA1 stream with
						// end-of-payload marker.
						rc_normalize(SEQ_EOPM);
						ret = LZMA_STREAM_END;
						goto out;
					}
				}
			}

			// Validate the distance we just decoded.
			if (unlikely(!dict_is_distance_valid(&dict, rep0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

		} else {
			rc_update_1(coder->is_rep[state]);

			// Repeated match
			//
			// The match distance is a value that we have had
			// earlier. The latest four match distances are
			// available as rep0, rep1, rep2 and rep3. We will
			// now decode which of them is the new distance.
			//
			// There cannot be a match if we haven't produced
			// any output, so check that first.
			if (unlikely(!dict_is_distance_valid(&dict, 0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

	case SEQ_IS_REP0:
			rc_if_0(coder->is_rep0[state], SEQ_IS_REP0) {
				rc_update_0(coder->is_rep0[state]);
				// The distance is rep0.

	case SEQ_IS_REP0_LONG:
				rc_if_0(coder->is_rep0_long[state][pos_state],
						SEQ_IS_REP0_LONG) {
					rc_update_0(coder->is_rep0_long[
							state][pos_state]);

					update_short_rep(state);

	case SEQ_SHORTREP:
					if (unlikely(dict_put(&dict, dict_get(
							&dict, rep0)))) {
						coder->sequence = SEQ_SHORTREP;
						goto out;
					}

					continue;
				}

				// Repeating more than one byte at
				// distance of rep0.
				rc_update_1(coder->is_rep0_long[
						state][pos_state]);

			} else {
				rc_update_1(coder->is_rep0[state]);

	case SEQ_IS_REP1:
				// The distance is rep1, rep2 or rep3. Once
				// we find out which one of these three, it
				// is stored to rep0 and rep1, rep2 and rep3
				// are updated accordingly.
				rc_if_0(coder->is_rep1[state], SEQ_IS_REP1) {
					rc_update_0(coder->is_rep1[state]);

					const uint32_t distance = rep1;
					rep1 = rep0;
					rep0 = distance;

				} else {
					rc_update_1(coder->is_rep1[state]);
	case SEQ_IS_REP2:
					rc_if_0(coder->is_rep2[state],
							SEQ_IS_REP2) {
						rc_update_0(coder->is_rep2[
								state]);

						const uint32_t distance = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;

					} else {
						rc_update_1(coder->is_rep2[
								state]);

						const uint32_t distance = rep3;
						rep3 = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;
					}
				}
			}

			update_long_rep(state);

			// Decode the length of the repeated match.
			len_decode(len, coder->rep_len_decoder,
					pos_state, SEQ_REP_LEN);
		}

		/////////////////////////////////
		// Repeat from history buffer. //
		/////////////////////////////////

		// The length is always between these limits. There is no way
		// to trigger the algorithm to set len outside this range.
		assert(len >= MATCH_LEN_MIN);
		assert(len <= MATCH_LEN_MAX);

	case SEQ_COPY:
		// Repeat len bytes from distance of rep0.
		if (unlikely(dict_repeat(&dict, rep0, &len))) {
			coder->sequence = SEQ_COPY;
			goto out;
		}
	}

	rc_normalize(SEQ_NORMALIZE);
	coder->sequence = SEQ_IS_MATCH;

out:
	// Save state

	// NOTE: Must not copy dict.limit.
	dictptr->pos = dict.pos;
	dictptr->full = dict.full;

	rc_from_local(coder->rc, *in_pos);

	coder->state = state;
	coder->rep0 = rep0;
	coder->rep1 = rep1;
	coder->rep2 = rep2;
	coder->rep3 = rep3;

	coder->probs = probs;
	coder->symbol = symbol;
	coder->limit = limit;
	coder->offset = offset;
	coder->len = len;

	// Update the remaining amount of uncompressed data if uncompressed
	// size was known.
	if (coder->uncompressed_size != LZMA_VLI_UNKNOWN) {
		coder->uncompressed_size -= dict.pos - dict_start;

		// Since there cannot be end of payload marker if the
		// uncompressed size was known, we check here if we
		// finished decoding.
		if (coder->uncompressed_size == 0 && ret == LZMA_OK
				&& coder->sequence != SEQ_NORMALIZE)
			ret = coder->sequence == SEQ_IS_MATCH
					? LZMA_STREAM_END : LZMA_DATA_ERROR;
	}

	// We can do an additional check in the range decoder to catch some
	// corrupted files.
	if (ret == LZMA_STREAM_END) {
		if (!rc_is_finished(coder->rc))
			ret = LZMA_DATA_ERROR;

		// Reset the range decoder so that it is ready to reinitialize
		// for a new LZMA2 chunk.
		rc_reset(coder->rc);
	}

	return ret;
}